

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QModelIndex>::append(QList<QModelIndex> *this,QList<QModelIndex> *other)

{
  bool bVar1;
  QModelIndex *pQVar2;
  QArrayDataPointer<QModelIndex> *in_RSI;
  QModelIndex *in_RDI;
  QArrayDataPointer<QModelIndex> *unaff_retaddr;
  QArrayDataPointer<QModelIndex> *in_stack_ffffffffffffffe0;
  GrowthPosition where;
  
  pQVar2 = in_RDI;
  bVar1 = isEmpty((QList<QModelIndex> *)0x8edd86);
  where = (GrowthPosition)((ulong)pQVar2 >> 0x20);
  if (!bVar1) {
    QArrayDataPointer<QModelIndex>::operator->(in_RSI);
    bVar1 = QArrayDataPointer<QModelIndex>::needsDetach(in_stack_ffffffffffffffe0);
    if (bVar1) {
      append((QList<QModelIndex> *)in_RSI,(QList<QModelIndex> *)in_RDI);
    }
    else {
      size((QList<QModelIndex> *)in_RSI);
      QArrayDataPointer<QModelIndex>::detachAndGrow
                (unaff_retaddr,where,(qsizetype)in_RSI,(QModelIndex **)in_RDI,
                 in_stack_ffffffffffffffe0);
      QArrayDataPointer<QModelIndex>::operator->((QArrayDataPointer<QModelIndex> *)in_RDI);
      QArrayDataPointer<QModelIndex>::operator->(in_RSI);
      pQVar2 = QArrayDataPointer<QModelIndex>::begin((QArrayDataPointer<QModelIndex> *)0x8eddfb);
      QArrayDataPointer<QModelIndex>::operator->(in_RSI);
      QArrayDataPointer<QModelIndex>::end((QArrayDataPointer<QModelIndex> *)pQVar2);
      QtPrivate::QGenericArrayOps<QModelIndex>::moveAppend
                ((QGenericArrayOps<QModelIndex> *)in_RSI,in_RDI,pQVar2);
    }
  }
  return;
}

Assistant:

inline void QList<T>::append(QList<T> &&other)
{
    Q_ASSERT(&other != this);
    if (other.isEmpty())
        return;
    if (other.d->needsDetach() || !std::is_nothrow_move_constructible_v<T>)
        return append(other);

    // due to precondition &other != this, we can unconditionally modify 'this'
    d.detachAndGrow(QArrayData::GrowsAtEnd, other.size(), nullptr, nullptr);
    Q_ASSERT(d.freeSpaceAtEnd() >= other.size());
    d->moveAppend(other.d->begin(), other.d->end());
}